

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmulqdq_tpl.h
# Opt level: O0

uint32_t crc32_vpclmulqdq(uint32_t crc32,uint8_t *buf,size_t len)

{
  ulong in_RDX;
  uint8_t *in_RSI;
  uint32_t in_EDI;
  crc32_fold crc_state;
  uint32_t in_stack_000000f4;
  size_t in_stack_000000f8;
  uint8_t *in_stack_00000100;
  crc32_fold *in_stack_00000108;
  crc32_fold *in_stack_ffffffffffffffb8;
  undefined4 local_4;
  
  if (in_RDX < 0x10) {
    local_4 = crc32_small(in_EDI,in_RSI,in_RDX);
  }
  else {
    crc32_fold_vpclmulqdq_reset(in_stack_ffffffffffffffb8);
    crc32_fold_vpclmulqdq(in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
    local_4 = crc32_fold_vpclmulqdq_final((crc32_fold *)crc_state.fold._48_8_);
  }
  return local_4;
}

Assistant:

Z_INTERNAL uint32_t CRC32(uint32_t crc32, const uint8_t *buf, size_t len) {
    /* For lens smaller than ~12, crc32_small method is faster.
     * But there are also minimum requirements for the pclmul functions due to alignment */
    if (len < 16)
        return crc32_small(crc32, buf, len);

    crc32_fold ALIGNED_(16) crc_state;
    CRC32_FOLD_RESET(&crc_state);
    CRC32_FOLD(&crc_state, buf, len, crc32);
    return CRC32_FOLD_FINAL(&crc_state);
}